

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.cc
# Opt level: O3

uint32_t hash_shuffle_2uint(uint64_t a,uint64_t b)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = ~a;
  uVar2 = (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) ^ a;
  uVar4 = ~b;
  uVar4 = (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38) ^ b;
  uVar1 = (uint)(ushort)(uVar2 >> 0x30) ^
          ((uint)(uVar2 >> 0x20) ^ (uint)(uVar2 >> 0x10) & 0xffff ^ (uint)uVar2) & 0xffff;
  uVar3 = (uint)(ushort)(uVar4 >> 0x30) ^
          ((uint)(uVar4 >> 0x20) ^ (uint)(uVar4 >> 0x10) & 0xffff ^ (uint)uVar4) & 0xffff;
  return ((uVar3 & 0xf000) << 0x10 |
         (uVar1 & 0xf000) << 0xc | (uVar1 & 0xf00) << 8 | (uVar1 & 0xf0) << 4 | uVar1 & 0xf |
         (uVar3 & 0xf) << 4 | (uVar3 & 0xf0) << 8 | (uVar3 & 0xf00) << 0xc) * 0x421;
}

Assistant:

uint32_t hash_shuffle_2uint(uint64_t a, uint64_t b)
{
    uint32_t c;

    a ^= bitswap64(a ^ UINT64_C(0xffffffffffffffff));
    b ^= bitswap64(b ^ UINT64_C(0xffffffffffffffff));

    a = (a & 0xffff) ^ ((a & 0xffff0000) >> 16) ^
        ((a & UINT64_C(0xffff00000000)) >> 32) ^
        ((a & UINT64_C(0xffff000000000000)) >> 48);
    b = (b & 0xffff) ^ ((b & 0xffff0000) >> 16) ^
        ((b & UINT64_C(0xffff00000000)) >> 32) ^
        ((b & UINT64_C(0xffff000000000000)) >> 48);

    c = (((a & 0x0000000f) << 0) |
        ((b & 0x0000000f) << 4) |
        ((a & 0x000000f0) << 4) |
        ((b & 0x000000f0) << 8) |
        ((a & 0x00000f00) << 8) |
        ((b & 0x00000f00) << 12) |
        ((a & 0x0000f000) << 12) |
        ((b & 0x0000f000) << 16));

    return (((c << 5) + c) << 5) + c;
}